

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

OPJ_BOOL opj_tcd_is_subband_area_of_interest
                   (opj_tcd_t *tcd,OPJ_UINT32 compno,OPJ_UINT32 resno,OPJ_UINT32 bandno,
                   OPJ_UINT32 band_x0,OPJ_UINT32 band_y0,OPJ_UINT32 band_x1,OPJ_UINT32 band_y1)

{
  opj_image_comp_t *poVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  opj_tcd_tilecomp_t *poVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  
  poVar1 = tcd->image->comps;
  uVar9 = (ulong)poVar1[compno].dx;
  if (uVar9 != 0) {
    poVar10 = tcd->tcd_image->tiles->comps + compno;
    uVar7 = (uint)(((tcd->win_x0 + uVar9) - 1) / uVar9);
    if (uVar7 < (uint)poVar10->x0) {
      uVar7 = poVar10->x0;
    }
    uVar11 = (ulong)poVar1[compno].dy;
    if (uVar11 != 0) {
      uVar5 = (uint)(((tcd->win_y0 + uVar11) - 1) / uVar11);
      if (uVar5 < (uint)poVar10->y0) {
        uVar5 = poVar10->y0;
      }
      uVar8 = (uint)(((uVar9 + tcd->win_x1) - 1) / uVar9);
      if ((uint)poVar10->x1 < uVar8) {
        uVar8 = poVar10->x1;
      }
      uVar2 = (uint)(((tcd->win_y1 + uVar11) - 1) / uVar11);
      if ((uint)poVar10->y1 < uVar2) {
        uVar2 = poVar10->y1;
      }
      iVar6 = (-(uint)(resno == 0) | -resno) + poVar10->numresolutions;
      bVar3 = (byte)iVar6;
      if (iVar6 != 0) {
        uVar12 = (bandno & 1) << (bVar3 - 1 & 0x1f);
        bVar13 = uVar12 <= uVar7;
        uVar12 = uVar7 - uVar12;
        uVar7 = 0;
        if (bVar13 && uVar12 != 0) {
          uVar7 = (uint)(~(-1L << (bVar3 & 0x3f)) + (ulong)uVar12 >> (bVar3 & 0x3f));
        }
      }
      if (iVar6 != 0) {
        uVar12 = (bandno >> 1) << (bVar3 - 1 & 0x1f);
        bVar13 = uVar12 <= uVar5;
        uVar12 = uVar5 - uVar12;
        uVar5 = 0;
        if (bVar13 && uVar12 != 0) {
          uVar5 = (uint)(~(-1L << (bVar3 & 0x3f)) + (ulong)uVar12 >> (bVar3 & 0x3f));
        }
      }
      if (iVar6 != 0) {
        uVar12 = (bandno & 1) << (bVar3 - 1 & 0x1f);
        bVar13 = uVar12 <= uVar8;
        uVar12 = uVar8 - uVar12;
        uVar8 = 0;
        if (bVar13 && uVar12 != 0) {
          uVar8 = (uint)(~(-1L << (bVar3 & 0x3f)) + (ulong)uVar12 >> (bVar3 & 0x3f));
        }
      }
      if (iVar6 != 0) {
        uVar12 = (bandno >> 1) << (bVar3 - 1 & 0x1f);
        bVar13 = uVar12 <= uVar2;
        uVar12 = uVar2 - uVar12;
        uVar2 = 0;
        if (bVar13 && uVar12 != 0) {
          uVar2 = (uint)(~(-1L << (bVar3 & 0x3f)) + (ulong)uVar12 >> (bVar3 & 0x3f));
        }
      }
      uVar12 = tcd->tcp->tccps[compno].qmfbid == 1 ^ 3;
      uVar4 = uVar7 - uVar12;
      if (uVar7 < uVar12) {
        uVar4 = 0;
      }
      uVar7 = uVar5 - uVar12;
      if (uVar5 < uVar12) {
        uVar7 = 0;
      }
      uVar5 = uVar8 + uVar12;
      if (CARRY4(uVar8,uVar12)) {
        uVar5 = 0xffffffff;
      }
      uVar8 = uVar12 + uVar2;
      if (CARRY4(uVar12,uVar2)) {
        uVar8 = 0xffffffff;
      }
      return (OPJ_BOOL)
             (uVar7 < band_y1 && ((uVar4 < band_x1 && band_x0 < uVar5) && band_y0 < uVar8));
    }
  }
  __assert_fail("b",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                ,0xac,"OPJ_UINT32 opj_uint_ceildiv(OPJ_UINT32, OPJ_UINT32)");
}

Assistant:

OPJ_BOOL opj_tcd_is_subband_area_of_interest(opj_tcd_t *tcd,
        OPJ_UINT32 compno,
        OPJ_UINT32 resno,
        OPJ_UINT32 bandno,
        OPJ_UINT32 band_x0,
        OPJ_UINT32 band_y0,
        OPJ_UINT32 band_x1,
        OPJ_UINT32 band_y1)
{
    /* Note: those values for filter_margin are in part the result of */
    /* experimentation. The value 2 for QMFBID=1 (5x3 filter) can be linked */
    /* to the maximum left/right extension given in tables F.2 and F.3 of the */
    /* standard. The value 3 for QMFBID=0 (9x7 filter) is more suspicious, */
    /* since F.2 and F.3 would lead to 4 instead, so the current 3 might be */
    /* needed to be bumped to 4, in case inconsistencies are found while */
    /* decoding parts of irreversible coded images. */
    /* See opj_dwt_decode_partial_53 and opj_dwt_decode_partial_97 as well */
    OPJ_UINT32 filter_margin = (tcd->tcp->tccps[compno].qmfbid == 1) ? 2 : 3;
    opj_tcd_tilecomp_t *tilec = &(tcd->tcd_image->tiles->comps[compno]);
    opj_image_comp_t* image_comp = &(tcd->image->comps[compno]);
    /* Compute the intersection of the area of interest, expressed in tile coordinates */
    /* with the tile coordinates */
    OPJ_UINT32 tcx0 = opj_uint_max(
                          (OPJ_UINT32)tilec->x0,
                          opj_uint_ceildiv(tcd->win_x0, image_comp->dx));
    OPJ_UINT32 tcy0 = opj_uint_max(
                          (OPJ_UINT32)tilec->y0,
                          opj_uint_ceildiv(tcd->win_y0, image_comp->dy));
    OPJ_UINT32 tcx1 = opj_uint_min(
                          (OPJ_UINT32)tilec->x1,
                          opj_uint_ceildiv(tcd->win_x1, image_comp->dx));
    OPJ_UINT32 tcy1 = opj_uint_min(
                          (OPJ_UINT32)tilec->y1,
                          opj_uint_ceildiv(tcd->win_y1, image_comp->dy));
    /* Compute number of decomposition for this band. See table F-1 */
    OPJ_UINT32 nb = (resno == 0) ?
                    tilec->numresolutions - 1 :
                    tilec->numresolutions - resno;
    /* Map above tile-based coordinates to sub-band-based coordinates per */
    /* equation B-15 of the standard */
    OPJ_UINT32 x0b = bandno & 1;
    OPJ_UINT32 y0b = bandno >> 1;
    OPJ_UINT32 tbx0 = (nb == 0) ? tcx0 :
                      (tcx0 <= (1U << (nb - 1)) * x0b) ? 0 :
                      opj_uint_ceildivpow2(tcx0 - (1U << (nb - 1)) * x0b, nb);
    OPJ_UINT32 tby0 = (nb == 0) ? tcy0 :
                      (tcy0 <= (1U << (nb - 1)) * y0b) ? 0 :
                      opj_uint_ceildivpow2(tcy0 - (1U << (nb - 1)) * y0b, nb);
    OPJ_UINT32 tbx1 = (nb == 0) ? tcx1 :
                      (tcx1 <= (1U << (nb - 1)) * x0b) ? 0 :
                      opj_uint_ceildivpow2(tcx1 - (1U << (nb - 1)) * x0b, nb);
    OPJ_UINT32 tby1 = (nb == 0) ? tcy1 :
                      (tcy1 <= (1U << (nb - 1)) * y0b) ? 0 :
                      opj_uint_ceildivpow2(tcy1 - (1U << (nb - 1)) * y0b, nb);
    OPJ_BOOL intersects;

    if (tbx0 < filter_margin) {
        tbx0 = 0;
    } else {
        tbx0 -= filter_margin;
    }
    if (tby0 < filter_margin) {
        tby0 = 0;
    } else {
        tby0 -= filter_margin;
    }
    tbx1 = opj_uint_adds(tbx1, filter_margin);
    tby1 = opj_uint_adds(tby1, filter_margin);

    intersects = band_x0 < tbx1 && band_y0 < tby1 && band_x1 > tbx0 &&
                 band_y1 > tby0;

#ifdef DEBUG_VERBOSE
    printf("compno=%u resno=%u nb=%u bandno=%u x0b=%u y0b=%u band=%u,%u,%u,%u tb=%u,%u,%u,%u -> %u\n",
           compno, resno, nb, bandno, x0b, y0b,
           band_x0, band_y0, band_x1, band_y1,
           tbx0, tby0, tbx1, tby1, intersects);
#endif
    return intersects;
}